

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk50(envy_bios *bios)

{
  byte bVar1;
  int iVar2;
  envy_bios_power_unk50_entry *peVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  uVar4 = (bios->power).unk50.offset;
  iVar8 = -0x16;
  if ((ulong)uVar4 != 0) {
    if (uVar4 < bios->length) {
      (bios->power).unk50.version = bios->data[uVar4];
    }
    else {
      (bios->power).unk50.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).unk50.version == '\x10') {
      uVar4 = (bios->power).unk50.offset + 1;
      if (uVar4 < bios->length) {
        (bios->power).unk50.hlen = bios->data[uVar4];
        iVar8 = 0;
      }
      else {
        (bios->power).unk50.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar8 = -0xe;
      }
      uVar4 = (bios->power).unk50.offset + 2;
      if (uVar4 < bios->length) {
        (bios->power).unk50.rlen = bios->data[uVar4];
        iVar5 = 0;
      }
      else {
        (bios->power).unk50.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar5 = -0xe;
      }
      uVar4 = (bios->power).unk50.offset + 3;
      if (uVar4 < bios->length) {
        (bios->power).unk50.entriesnum = bios->data[uVar4];
        iVar2 = 0;
      }
      else {
        (bios->power).unk50.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar2 = -0xe;
      }
      (bios->power).unk50.valid = (iVar5 == 0 && iVar8 == 0) && iVar2 == 0;
      bVar1 = (bios->power).unk50.entriesnum;
      peVar3 = (envy_bios_power_unk50_entry *)malloc((ulong)((uint)bVar1 * 4) * 5);
      (bios->power).unk50.entries = peVar3;
      if (bVar1 != 0) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          peVar3 = (bios->power).unk50.entries;
          uVar4 = (uint)(bios->power).unk50.rlen * (int)uVar6 +
                  (uint)(bios->power).unk50.hlen + (bios->power).unk50.offset;
          *(uint *)((long)&peVar3->offset + lVar7) = uVar4;
          if (uVar4 < bios->length) {
            (&peVar3->mode)[lVar7] = bios->data[uVar4];
          }
          else {
            (&peVar3->mode)[lVar7] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          }
          iVar8 = *(int *)((long)&peVar3->offset + lVar7);
          uVar4 = iVar8 + 3;
          if (uVar4 < bios->length) {
            *(ushort *)((long)&peVar3->t0 + lVar7) =
                 CONCAT11(bios->data[uVar4],bios->data[iVar8 + 2]);
          }
          else {
            *(undefined2 *)((long)&peVar3->t0 + lVar7) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          iVar8 = *(int *)((long)&peVar3->offset + lVar7);
          uVar4 = iVar8 + 5;
          if (uVar4 < bios->length) {
            *(ushort *)((long)&peVar3->t1 + lVar7) =
                 CONCAT11(bios->data[uVar4],bios->data[iVar8 + 4]);
          }
          else {
            *(undefined2 *)((long)&peVar3->t1 + lVar7) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          iVar8 = *(int *)((long)&peVar3->offset + lVar7);
          uVar4 = iVar8 + 7;
          if (uVar4 < bios->length) {
            *(ushort *)((long)&peVar3->t2 + lVar7) =
                 CONCAT11(bios->data[uVar4],bios->data[iVar8 + 6]);
          }
          else {
            *(undefined2 *)((long)&peVar3->t2 + lVar7) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          iVar8 = *(int *)((long)&peVar3->offset + lVar7);
          uVar4 = iVar8 + 9;
          if (uVar4 < bios->length) {
            *(ushort *)((long)&peVar3->interval_us + lVar7) =
                 CONCAT11(bios->data[uVar4],bios->data[iVar8 + 8]);
          }
          else {
            *(undefined2 *)((long)&peVar3->interval_us + lVar7) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          iVar8 = *(int *)((long)&peVar3->offset + lVar7);
          uVar4 = iVar8 + 0x13;
          if (uVar4 < bios->length) {
            *(ushort *)((long)&peVar3->down_off + lVar7) =
                 CONCAT11(bios->data[uVar4],bios->data[iVar8 + 0x12]);
          }
          else {
            *(undefined2 *)((long)&peVar3->down_off + lVar7) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          iVar8 = *(int *)((long)&peVar3->offset + lVar7);
          uVar4 = iVar8 + 0x15;
          if (uVar4 < bios->length) {
            *(ushort *)((long)&peVar3->up_off + lVar7) =
                 CONCAT11(bios->data[uVar4],bios->data[iVar8 + 0x14]);
          }
          else {
            *(undefined2 *)((long)&peVar3->up_off + lVar7) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x14;
        } while (uVar6 < (bios->power).unk50.entriesnum);
      }
      iVar8 = 0;
    }
    else {
      fprintf(_stderr,"Unknown THERMAL POLICY table version 0x%x\n");
    }
  }
  return iVar8;
}

Assistant:

int envy_bios_parse_power_unk50(struct envy_bios *bios) {
	struct envy_bios_power_unk50 *unk50 = &bios->power.unk50;
	int i, err = 0;

	if (!unk50->offset)
		return -EINVAL;

	bios_u8(bios, unk50->offset + 0x0, &unk50->version);
	switch(unk50->version) {
	case 0x10:
		err |= bios_u8(bios, unk50->offset + 0x1, &unk50->hlen);
		err |= bios_u8(bios, unk50->offset + 0x2, &unk50->rlen);
		err |= bios_u8(bios, unk50->offset + 0x3, &unk50->entriesnum);
		unk50->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERMAL POLICY table version 0x%x\n", unk50->version);
		return -EINVAL;
	};

	err = 0;
	unk50->entries = malloc(unk50->entriesnum * sizeof(struct envy_bios_power_unk50_entry));
	for (i = 0; i < unk50->entriesnum; i++) {
		struct envy_bios_power_unk50_entry *e = &unk50->entries[i];

		e->offset = unk50->offset + unk50->hlen + i * unk50->rlen;
		bios_u8 (bios, e->offset + 0x0, &e->mode);
		bios_u16(bios, e->offset + 0x2, &e->t0);
		bios_u16(bios, e->offset + 0x4, &e->t1);
		bios_u16(bios, e->offset + 0x6, &e->t2);
		bios_u16(bios, e->offset + 0x8, &e->interval_us);

		bios_u16(bios, e->offset + 0x12, &e->down_off);
		bios_u16(bios, e->offset + 0x14, &e->up_off);
	}

	return 0;
}